

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

void test_read_at_least_chunks(void)

{
  char *__s2;
  int iVar1;
  memory_stream *ms;
  size_t sVar2;
  size_t local_70;
  size_t second_chunk;
  size_t first_chunk;
  undefined1 local_58 [4];
  cio_error err;
  cio_read_buffer rb;
  uint8_t buffer [40];
  client *client;
  
  ms = (memory_stream *)malloc(0x100);
  iVar1 = memory_stream_init(ms,test_read_at_least_chunks::test_data);
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x2e2,UNITY_DISPLAY_STYLE_INT);
  read_some_fake.custom_fake = read_some_chunks;
  dummy_read_handler_fake.custom_fake = save_to_check_buffer;
  first_chunk._4_4_ = cio_read_buffer_init((cio_read_buffer *)local_58,&rb.fetch_ptr,0x28);
  UnityAssertEqualNumber
            (0,(long)first_chunk._4_4_,"Read buffer was not initialized correctly!",0x2e9,
             UNITY_DISPLAY_STYLE_INT);
  second_chunk = 2;
  first_chunk._4_4_ = cio_buffered_stream_init((cio_buffered_stream *)(ms + 1),(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)first_chunk._4_4_,"Buffer was not initialized correctly!",0x2ed,
             UNITY_DISPLAY_STYLE_INT);
  first_chunk._4_4_ =
       cio_buffered_stream_read_at_least
                 ((cio_buffered_stream *)(ms + 1),(cio_read_buffer *)local_58,second_chunk,
                  dummy_read_handler,&second_chunk);
  UnityAssertEqualNumber
            (0,(long)first_chunk._4_4_,"Return value not correct!",0x2ef,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x2f0,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_read_handler_fake.arg2_history[0],
             "Handler was not called with CIO_SUCCESS!",0x2f1,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)local_58,(UNITY_INT)dummy_read_handler_fake.arg3_history[0],
             "Handler was not called with original read buffer!",0x2f2,UNITY_DISPLAY_STYLE_INT);
  sVar2 = strlen(test_read_at_least_chunks::test_data);
  local_70 = sVar2 - second_chunk;
  first_chunk._4_4_ =
       cio_buffered_stream_read_at_least
                 ((cio_buffered_stream *)(ms + 1),(cio_read_buffer *)local_58,local_70,
                  dummy_read_handler,&local_70);
  UnityAssertEqualNumber
            (0,(long)first_chunk._4_4_,"Return value not correct!",0x2f6,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (2,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x2f7,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_read_handler_fake.arg2_history[1],
             "Handler was not called with CIO_SUCCESS!",0x2f8,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)local_58,(UNITY_INT)dummy_read_handler_fake.arg3_history[1],
             "Handler was not called with original read buffer!",0x2f9,UNITY_DISPLAY_STYLE_INT);
  __s2 = test_read_at_least_chunks::test_data;
  sVar2 = strlen(test_read_at_least_chunks::test_data);
  iVar1 = memcmp(first_check_buffer,__s2,sVar2);
  if (iVar1 == 0) {
    first_chunk._4_4_ = cio_buffered_stream_close((cio_buffered_stream *)(ms + 1));
    UnityAssertEqualNumber
              (0,(long)first_chunk._4_4_,"Return value not correct!",0x2fe,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x2ff,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("Handler was not called with correct data!",0x2fb);
}

Assistant:

static void test_read_at_least_chunks(void)
{
	struct client *client = malloc(sizeof(*client));

	static const char *test_data = "HelloWorld!";
	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, test_data), "Could not allocate memory for test!");
	read_some_fake.custom_fake = read_some_chunks;
	dummy_read_handler_fake.custom_fake = save_to_check_buffer;

	uint8_t buffer[40];
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, &buffer, sizeof(buffer));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");

	size_t first_chunk = 2;
	err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");
	err = cio_buffered_stream_read_at_least(&client->bs, &rb, first_chunk, dummy_read_handler, &first_chunk);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, dummy_read_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_read_handler_fake.arg2_history[0], "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, dummy_read_handler_fake.arg3_history[0], "Handler was not called with original read buffer!");

	size_t second_chunk = strlen(test_data) - first_chunk;
	err = cio_buffered_stream_read_at_least(&client->bs, &rb, second_chunk, dummy_read_handler, &second_chunk);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(2, dummy_read_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_read_handler_fake.arg2_history[1], "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, dummy_read_handler_fake.arg3_history[1], "Handler was not called with original read buffer!");

	TEST_ASSERT_MESSAGE(memcmp((const char *)first_check_buffer, test_data, strlen(test_data)) == 0, "Handler was not called with correct data!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
}